

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateSwitch(ExpressionEvalContext *ctx,ExprSwitch *expression)

{
  StackFrame *pSVar1;
  ExprBase *expression_00;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  longlong in_RAX;
  StackFrame **ppSVar9;
  ExprBase *pEVar10;
  ExprBase *pEVar11;
  undefined4 extraout_var;
  char *msg;
  IntrusiveList<ExprBase> *pIVar12;
  IntrusiveList<ExprBase> *pIVar13;
  longlong result;
  
  result = in_RAX;
  bVar5 = AddInstruction(ctx);
  if (bVar5) {
    ppSVar9 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
    pSVar1 = *ppSVar9;
    if (pSVar1->targetYield == 0) {
      pEVar10 = Evaluate(ctx,expression->condition);
      if (pEVar10 != (ExprBase *)0x0) {
        pIVar13 = &expression->cases;
        pIVar12 = &expression->blocks;
        bVar5 = false;
        do {
          pEVar10 = pIVar13->head;
          if ((pEVar10 == (ExprBase *)0x0) ||
             (expression_00 = pIVar12->head, expression_00 == (ExprBase *)0x0)) {
            if (expression->defaultBlock != (ExprBase *)0x0) {
              pEVar10 = Evaluate(ctx,expression->defaultBlock);
              if (pEVar10 == (ExprBase *)0x0) {
                return (ExprBase *)0x0;
              }
              uVar7 = pSVar1->breakDepth;
              if (uVar7 != 0) {
LAB_00139bb6:
                pSVar1->breakDepth = uVar7 - 1;
              }
            }
            pAVar2 = ctx->ctx->allocator;
            iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
            pEVar10 = (ExprBase *)CONCAT44(extraout_var,iVar8);
            pSVar3 = (expression->super_ExprBase).source;
            pTVar4 = ctx->ctx->typeVoid;
            pEVar10->typeID = 2;
            pEVar10->source = pSVar3;
            pEVar10->type = pTVar4;
            pEVar10->next = (ExprBase *)0x0;
            pEVar10->listed = false;
            pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
            pEVar10 = CheckType(&expression->super_ExprBase,pEVar10);
            return pEVar10;
          }
          bVar6 = AddInstruction(ctx);
          if (!bVar6) {
            return (ExprBase *)0x0;
          }
          if (bVar5) {
LAB_00139b62:
            pEVar11 = Evaluate(ctx,expression_00);
            if (pEVar11 == (ExprBase *)0x0) {
              return (ExprBase *)0x0;
            }
            uVar7 = pSVar1->breakDepth;
            bVar5 = true;
            if (uVar7 != 0) goto LAB_00139bb6;
          }
          else {
            pEVar11 = Evaluate(ctx,pEVar10);
            if (pEVar11 == (ExprBase *)0x0) {
              return (ExprBase *)0x0;
            }
            bVar5 = TryTakeLong(pEVar11,&result);
            if (!bVar5) {
              msg = "ERROR: failed to evaluate \'case\' value";
              goto LAB_00139ade;
            }
            if (result != 0) goto LAB_00139b62;
            bVar5 = false;
          }
          pIVar13 = (IntrusiveList<ExprBase> *)&pEVar10->next;
          pIVar12 = (IntrusiveList<ExprBase> *)&expression_00->next;
        } while( true );
      }
    }
    else {
      msg = "ERROR: can\'t yield back into a switch statement";
LAB_00139ade:
      Report(ctx,msg);
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateSwitch(ExpressionEvalContext &ctx, ExprSwitch *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(frame->targetYield)
		return Report(ctx, "ERROR: can't yield back into a switch statement");

	ExprBase *condition = Evaluate(ctx, expression->condition);

	if(!condition)
		return NULL;

	bool matched = false;

	for(ExprBase *currCase = expression->cases.head, *currBlock = expression->blocks.head; currCase && currBlock; currCase = currCase->next, currBlock = currBlock->next)
	{
		if(!AddInstruction(ctx))
			return NULL;

		if(!matched)
		{
			ExprBase *value = Evaluate(ctx, currCase);

			if(!value)
				return NULL;

			long long result;
			if(!TryTakeLong(value, result))
				return Report(ctx, "ERROR: failed to evaluate 'case' value");

			// Try next case
			if(!result)
				continue;

			matched = true;
		}

		if(!Evaluate(ctx, currBlock))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;

			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
		}
	}

	if(expression->defaultBlock)
	{
		if(!Evaluate(ctx, expression->defaultBlock))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;

			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}